

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

UtxoObjectStruct * __thiscall
cfd::js::api::json::UtxoObject::ConvertToStruct
          (UtxoObjectStruct *__return_storage_ptr__,UtxoObject *this)

{
  UtxoObject *this_local;
  UtxoObjectStruct *result;
  
  UtxoObjectStruct::UtxoObjectStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->txid_);
  __return_storage_ptr__->vout = this->vout_;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->address,(string *)&this->address_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->locking_script,(string *)&this->locking_script_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->descriptor,(string *)&this->descriptor_);
  __return_storage_ptr__->amount = this->amount_;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->confidential_value_commitment,
             (string *)&this->confidential_value_commitment_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->asset,(string *)&this->asset_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->confidential_asset_commitment,
             (string *)&this->confidential_asset_commitment_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->blind_factor,(string *)&this->blind_factor_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->asset_blind_factor,
             (string *)&this->asset_blind_factor_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->script_sig_template,
             (string *)&this->script_sig_template_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

UtxoObjectStruct UtxoObject::ConvertToStruct() const {  // NOLINT
  UtxoObjectStruct result;
  result.txid = txid_;
  result.vout = vout_;
  result.address = address_;
  result.locking_script = locking_script_;
  result.descriptor = descriptor_;
  result.amount = amount_;
  result.confidential_value_commitment = confidential_value_commitment_;
  result.asset = asset_;
  result.confidential_asset_commitment = confidential_asset_commitment_;
  result.blind_factor = blind_factor_;
  result.asset_blind_factor = asset_blind_factor_;
  result.script_sig_template = script_sig_template_;
  result.ignore_items = ignore_items;
  return result;
}